

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

void Gia_ManFromBridgeHolds(FILE *pFile,int iPoProved)

{
  int iVar1;
  int iPoProved_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"%.6d",0x65);
  fprintf((FILE *)pFile," ");
  iVar1 = aigerNumSize(iPoProved);
  fprintf((FILE *)pFile,"%.16d",(ulong)(iVar1 + 3));
  fprintf((FILE *)pFile," ");
  fputc(3,(FILE *)pFile);
  fputc(1,(FILE *)pFile);
  Gia_AigerWriteUnsignedFile(pFile,iPoProved);
  fputc(0,(FILE *)pFile);
  fflush((FILE *)pFile);
  return;
}

Assistant:

void Gia_ManFromBridgeHolds( FILE * pFile, int iPoProved )
{
    fprintf( pFile, "%.6d", 101 /*message type = Result*/);
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", 3 + aigerNumSize(iPoProved) /*size in bytes*/);
    fprintf( pFile, " " );

    fputc( (char)BRIDGE_VALUE_1, pFile ); // true
    fputc( (char)1, pFile ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsignedFile( pFile, iPoProved ); // number of the property (Armin's encoding)
    fputc( (char)0, pFile ); // no invariant
    fflush(pFile);
}